

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O2

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::reconstruct_path
          (vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
          vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
          came_from,vector<double,_std::allocator<double>_> start,maze_s final)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined8 *in_RCX;
  long *in_RDX;
  initializer_list<HBF::maze_s> __l;
  allocator_type local_79;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  maze_s current;
  
  local_68._8_8_ = local_68._0_8_;
  current.y = (double)came_from.
                      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  current.theta =
       (double)start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  current.g = (double)came_from.
                      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  current.x = (double)came_from.
                      super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  __l._M_len = 1;
  __l._M_array = &current;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (__return_storage_ptr__,__l,&local_79);
  iVar5 = theta_to_stack_number
                    (this,(double)start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
  local_78 = (double)*in_RDX;
  local_68._0_8_ =
       came_from.
       super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  dVar3 = floor((double)came_from.
                        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  local_78 = *(double *)((long)local_78 + (long)iVar5 * 0x18);
  dVar4 = floor((double)local_68._0_8_);
  lVar2 = *(long *)((long)local_78 + (long)(int)dVar3 * 0x18);
  pdVar1 = (double *)(lVar2 + (long)(int)dVar4 * 0x20);
  current.g = *pdVar1;
  current.x = pdVar1[1];
  pdVar1 = (double *)(lVar2 + 0x10 + (long)(int)dVar4 * 0x20);
  current.y = *pdVar1;
  current.theta = pdVar1[1];
  iVar5 = theta_to_stack_number(this,current.theta);
  local_78 = current.x;
  dStack_70 = current.y;
  while( true ) {
    pdVar1 = (double *)*in_RCX;
    if ((local_78 == *pdVar1) && (!NAN(local_78) && !NAN(*pdVar1))) {
      return __return_storage_ptr__;
    }
    local_68._8_4_ = SUB84(dStack_70,0);
    local_68._0_8_ = dStack_70;
    local_68._12_4_ = (int)((ulong)dStack_70 >> 0x20);
    if ((dStack_70 == pdVar1[1]) && (!NAN(dStack_70) && !NAN(pdVar1[1]))) break;
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back
              (__return_storage_ptr__,&current);
    lVar2 = *in_RDX;
    dVar3 = floor(local_78);
    lVar2 = *(long *)(lVar2 + (long)iVar5 * 0x18);
    dVar4 = floor((double)local_68._0_8_);
    lVar2 = *(long *)(lVar2 + (long)(int)dVar3 * 0x18);
    pdVar1 = (double *)(lVar2 + (long)(int)dVar4 * 0x20);
    current.g = *pdVar1;
    local_78 = pdVar1[1];
    pdVar1 = (double *)(lVar2 + 0x10 + (long)(int)dVar4 * 0x20);
    dStack_70 = *pdVar1;
    current.theta = pdVar1[1];
    current.x = local_78;
    current.y = dStack_70;
    iVar5 = theta_to_stack_number(this,current.theta);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s>
HBF::reconstruct_path(vector<vector<vector<HBF::maze_s> > > came_from, vector<double> start, HBF::maze_s final) {

    vector<maze_s> path = {final};

    int stack = theta_to_stack_number(final.theta);

    maze_s current = came_from[stack][idx(final.x)][idx(final.y)];

    stack = theta_to_stack_number(current.theta);

    double x = current.x;
    double y = current.y;
    while (x != start[0] && y != start[1]) {
        path.push_back(current);
        current = came_from[stack][idx(x)][idx(y)];
        x = current.x;
        y = current.y;
        stack = theta_to_stack_number(current.theta);
    }

    return path;

}